

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

size_t Assimp::IFC::CloseWindows
                 (ContourVector *contours,IfcMatrix4 *minv,OpeningRefVector *contours_to_openings,
                 TempMesh *curmesh)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  pointer pvVar11;
  long *plVar12;
  uint *puVar13;
  iterator __position;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  TempMesh *this;
  long lVar17;
  long *plVar18;
  long lVar19;
  long *plVar20;
  ulong uVar21;
  aiVector3t<double> *paVar22;
  pointer pPVar23;
  IfcVector2 *proj_point_1;
  pointer paVar24;
  long lVar25;
  pointer paVar26;
  double *pdVar27;
  iterator iVar28;
  ulong *puVar29;
  int iVar30;
  const_iterator cit;
  iterator current;
  pointer paVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  IfcVector3 contourNormal;
  aiVector3t<double> res;
  OpeningRefs *__range5;
  IfcVector3 start1;
  aiVector3t<double> res_1;
  size_t local_120;
  IfcVector3 local_118;
  aiVector3t<double> local_f8;
  pointer local_d8;
  ContourVector *local_d0;
  long *local_c8;
  uint local_bc;
  aiVector3t<double> local_b8;
  aiVector3t<double> *local_98;
  aiVector3t<double> *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  IfcVector3 *local_80;
  IfcVector3 *local_78;
  ProjectedWindowContour *local_70;
  undefined1 local_68 [16];
  double local_58;
  TempMesh *local_50;
  OpeningRefVector *local_48;
  pointer local_40;
  pointer local_38;
  
  current._M_current =
       (contours->
       super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pPVar23 = (contours->
            super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (current._M_current == pPVar23) {
    return 0;
  }
  local_88 = &curmesh->mVertcnt;
  local_120 = 0;
  local_d8 = pPVar23;
  local_d0 = contours;
  local_50 = curmesh;
  local_48 = contours_to_openings;
LAB_005b0ea1:
  paVar26 = ((current._M_current)->contour).
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  paVar24 = ((current._M_current)->contour).
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_70 = current._M_current;
  if (paVar26 != paVar24) {
    pvVar11 = (local_48->
              super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar17 = ((ulong)((long)current._M_current -
                     (long)(contours->
                           super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x6276276276276278;
    plVar20 = *(long **)((long)pvVar11 + lVar17);
    plVar12 = *(long **)((long)pvVar11 + lVar17 + 8);
    if (plVar20 != plVar12) {
      plVar18 = plVar20;
LAB_005b0efa:
      if (*(long *)(*plVar18 + 0x40) == *(long *)(*plVar18 + 0x48)) goto code_r0x005b0f0b;
      std::vector<bool,_std::allocator<bool>_>::resize
                (&(current._M_current)->skiplist,(long)paVar24 - (long)paVar26 >> 4,false);
      FindAdjacentContours(current,contours);
      FindBorderContours(current);
      if ((current._M_current)->is_rectangular == true) {
        FindLikelyCrossingLines(current);
      }
      this = local_50;
      puVar29 = ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      lVar25 = (long)((current._M_current)->contour).
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)((current._M_current)->contour).
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>._M_impl
                 .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>._M_impl
                 .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)puVar29)
          * 8 != lVar25 >> 4) {
        __assert_fail("(*it).skiplist.size() == (*it).contour.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                      ,0x386,
                      "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                     );
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&local_50->mVerts,
                 (lVar25 >> 2) +
                 ((long)(local_50->mVerts).
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_50->mVerts).
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (local_88,((long)((current._M_current)->contour).
                                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)((current._M_current)->contour).
                                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4) +
                          ((long)(this->mVertcnt).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->mVertcnt).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2));
      puVar13 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar13) {
        bVar15 = false;
      }
      else {
        TempMesh::ComputePolygonNormal
                  (&local_f8,
                   (this->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,(ulong)*puVar13,true);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&local_b8,
                   (long)((current._M_current)->contour).
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)((current._M_current)->contour).
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_118
                  );
        paVar26 = ((current._M_current)->contour).
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (((current._M_current)->contour).
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish != paVar26) {
          lVar25 = 8;
          lVar19 = 0x10;
          uVar21 = 0;
          do {
            dVar3 = *(double *)((long)paVar26 + lVar25 + -8);
            dVar33 = *(double *)((long)&paVar26->x + lVar25);
            dVar4 = minv->c2;
            dVar5 = minv->c1;
            dVar34 = minv->c3;
            dVar6 = minv->c4;
            dVar7 = minv->b2;
            dVar8 = minv->b1;
            dVar9 = minv->b3;
            dVar10 = minv->b4;
            pdVar27 = (double *)((long)local_b8.x + lVar19 + -0x10);
            *pdVar27 = minv->a4 + minv->a3 * 0.0 + dVar3 * minv->a1 + minv->a2 * dVar33;
            pdVar27[1] = dVar10 + dVar9 * 0.0 + dVar3 * dVar8 + dVar7 * dVar33;
            *(double *)((long)(double *)local_b8.x + lVar19) =
                 dVar34 * 0.0 + dVar5 * dVar3 + dVar4 * dVar33 + dVar6;
            uVar21 = uVar21 + 1;
            paVar26 = ((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar25 = lVar25 + 0x10;
            lVar19 = lVar19 + 0x18;
          } while (uVar21 < (ulong)((long)((current._M_current)->contour).
                                          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar26
                                   >> 4));
        }
        TempMesh::ComputePolygonNormal
                  (&local_118,(IfcVector3 *)local_b8.x,
                   ((long)local_b8.y - (long)local_b8.x >> 3) * -0x5555555555555555,true);
        bVar15 = 0.0 < local_118.z * local_f8.z +
                       local_118.x * local_f8.x + local_118.y * local_f8.y;
        if ((IfcVector3 *)local_b8.x != (IfcVector3 *)0x0) {
          operator_delete((void *)local_b8.x);
        }
      }
      local_f8.x = 0.0;
      local_f8.y = 0.0;
      local_f8.z = 0.0;
      local_b8.z = 0.0;
      local_b8.x = 0.0;
      local_b8.y = 0.0;
      paVar26 = ((current._M_current)->contour).
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      paVar24 = ((current._M_current)->contour).
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish;
      pPVar23 = local_d8;
      contours = local_d0;
      if (paVar26 != paVar24) {
        local_c8 = (long *)((long)pvVar11 + lVar17);
        local_78 = (IfcVector3 *)local_68;
        if (bVar15) {
          local_78 = &local_118;
        }
        local_80 = &local_118;
        if (bVar15) {
          local_80 = (IfcVector3 *)local_68;
        }
        local_90 = &local_b8;
        if (bVar15) {
          local_90 = &local_f8;
        }
        local_98 = &local_f8;
        if (bVar15) {
          local_98 = &local_b8;
        }
        local_38 = paVar24;
        local_40 = paVar24 + -1;
        bVar32 = false;
        uVar21 = 0;
        paVar24 = paVar26;
        do {
          local_118.x = 0.0;
          local_118.y = 0.0;
          local_118.z = 0.0;
          dVar3 = paVar24->x;
          dVar33 = paVar24->y;
          dVar4 = minv->a4 + minv->a3 * 0.0 + dVar3 * minv->a1 + minv->a2 * dVar33;
          dVar5 = minv->b4 + minv->b3 * 0.0 + dVar3 * minv->b1 + minv->b2 * dVar33;
          local_68._8_4_ = SUB84(dVar5,0);
          local_68._0_8_ = dVar4;
          local_68._12_4_ = (int)((ulong)dVar5 >> 0x20);
          local_58 = minv->c3 * 0.0 + dVar3 * minv->c1 + dVar33 * minv->c2 + minv->c4;
          plVar20 = (long *)*local_c8;
          if (plVar20 != (long *)local_c8[1]) {
            dVar3 = 10000000000.0;
            do {
              for (pdVar27 = *(double **)(*plVar20 + 0x40); pdVar27 != *(double **)(*plVar20 + 0x48)
                  ; pdVar27 = pdVar27 + 3) {
                dVar34 = dVar4 - *pdVar27;
                dVar33 = local_58 - pdVar27[2];
                dVar33 = dVar33 * dVar33 +
                         dVar34 * dVar34 + (dVar5 - pdVar27[1]) * (dVar5 - pdVar27[1]);
                if ((dVar33 < dVar3) && (1e-05 <= dVar33)) {
                  local_118.z = pdVar27[2];
                  local_118.x = (double)*pdVar27;
                  local_118.y = pdVar27[1];
                  dVar3 = dVar33;
                }
              }
              plVar20 = plVar20 + 1;
            } while (plVar20 != (long *)local_c8[1]);
          }
          if (bVar32) {
            ppaVar1 = &(this->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + -2;
          }
          else {
            bVar32 = (bool)(paVar24 == paVar26 ^ bVar15);
            paVar22 = &local_118;
            if (bVar32) {
              paVar22 = (aiVector3t<double> *)local_68;
            }
            iVar28._M_current =
                 (this->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                (this->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this,
                         iVar28,paVar22);
              iVar28._M_current =
                   (this->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              (iVar28._M_current)->z = paVar22->z;
              dVar3 = paVar22->y;
              (iVar28._M_current)->x = paVar22->x;
              (iVar28._M_current)->y = dVar3;
              iVar28._M_current =
                   (this->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
              (this->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar28._M_current;
            }
            paVar22 = (aiVector3t<double> *)local_68;
            if (bVar32) {
              paVar22 = &local_118;
            }
            if (iVar28._M_current ==
                (this->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this,
                         iVar28,paVar22);
            }
            else {
              (iVar28._M_current)->z = paVar22->z;
              dVar3 = paVar22->y;
              (iVar28._M_current)->x = paVar22->x;
              (iVar28._M_current)->y = dVar3;
              ppaVar1 = &(this->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            local_bc = 4;
            __position._M_current =
                 (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_88,__position,&local_bc);
            }
            else {
              *__position._M_current = 4;
              ppuVar2 = &(this->mVertcnt).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar2 = *ppuVar2 + 1;
            }
            local_120 = local_120 + 1;
          }
          if (paVar24 == paVar26) {
            local_f8.z = local_58;
            local_f8.x = (double)local_68._0_8_;
            local_f8.y = (double)local_68._8_8_;
            local_b8.x = local_118.x;
            local_b8.y = local_118.y;
            local_b8.z = local_118.z;
          }
          else {
            iVar28._M_current =
                 (this->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                (this->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this,
                         iVar28,local_78);
              iVar28._M_current =
                   (this->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              (iVar28._M_current)->z = local_78->z;
              dVar3 = local_78->y;
              (iVar28._M_current)->x = local_78->x;
              (iVar28._M_current)->y = dVar3;
              iVar28._M_current =
                   (this->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
              (this->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar28._M_current;
            }
            if (iVar28._M_current ==
                (this->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this,
                         iVar28,local_80);
            }
            else {
              (iVar28._M_current)->z = local_80->z;
              dVar3 = local_80->y;
              (iVar28._M_current)->x = local_80->x;
              (iVar28._M_current)->y = dVar3;
              ppaVar1 = &(this->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            if (paVar24 == local_40) {
              if ((*puVar29 >> (uVar21 & 0x3f) & 1) == 0) {
                iVar28._M_current =
                     (this->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar28._M_current ==
                    (this->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                  _M_realloc_insert<aiVector3t<double>const&>
                            ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this,
                             iVar28,local_90);
                  iVar28._M_current =
                       (this->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  (iVar28._M_current)->z = local_90->z;
                  dVar3 = local_90->y;
                  (iVar28._M_current)->x = local_90->x;
                  (iVar28._M_current)->y = dVar3;
                  iVar28._M_current =
                       (this->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                  (this->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish = iVar28._M_current;
                }
                if (iVar28._M_current ==
                    (this->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                  _M_realloc_insert<aiVector3t<double>const&>
                            ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this,
                             iVar28,local_98);
                }
                else {
                  (iVar28._M_current)->z = local_98->z;
                  dVar3 = local_98->y;
                  (iVar28._M_current)->x = local_98->x;
                  (iVar28._M_current)->y = dVar3;
                  ppaVar1 = &(this->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
              }
              else {
                ppuVar2 = &(this->mVertcnt).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppuVar2 = *ppuVar2 + -1;
                local_120 = local_120 - 1;
                ppaVar1 = &(this->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + -2;
              }
            }
          }
          paVar24 = paVar24 + 1;
          iVar30 = (int)uVar21;
          uVar14 = *puVar29;
          puVar29 = puVar29 + (iVar30 == 0x3f);
          uVar16 = iVar30 + 1;
          if (iVar30 == 0x3f) {
            uVar16 = 0;
          }
          bVar32 = (uVar14 >> (uVar21 & 0x3f) & 1) != 0;
          uVar21 = (ulong)uVar16;
          pPVar23 = local_d8;
          contours = local_d0;
        } while (paVar24 != local_38);
      }
    }
  }
  goto LAB_005b1737;
code_r0x005b0f0b:
  plVar18 = plVar18 + 1;
  if (plVar18 == plVar12) goto code_r0x005b0f14;
  goto LAB_005b0efa;
code_r0x005b0f14:
  pPVar23 = local_d8;
  contours = local_d0;
  local_c8 = plVar12;
  if (plVar20 != plVar12) {
    do {
      lVar17 = *plVar20;
      if (*(long *)(lVar17 + 0x40) != *(long *)(lVar17 + 0x48)) {
        __assert_fail("opening->wallPoints.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                      ,0x3ec,
                      "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                     );
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)(lVar17 + 0x40)
                 ,((long)(local_70->contour).
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_70->contour).
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) +
                  (*(long *)(lVar17 + 0x50) - *(long *)(lVar17 + 0x40) >> 3) * -0x5555555555555555);
      paVar31 = paVar26;
      do {
        dVar3 = paVar31->x;
        dVar33 = paVar31->y;
        local_f8.x = minv->a4 + minv->a3 * 0.0 + dVar3 * minv->a1 + minv->a2 * dVar33;
        local_f8.y = minv->b4 + minv->b3 * 0.0 + dVar3 * minv->b1 + minv->b2 * dVar33;
        local_f8.z = minv->c3 * 0.0 + dVar3 * minv->c1 + dVar33 * minv->c2 + minv->c4;
        iVar28._M_current = *(aiVector3t<double> **)(lVar17 + 0x48);
        if (iVar28._M_current == *(aiVector3t<double> **)(lVar17 + 0x50)) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                     (lVar17 + 0x40),iVar28,&local_f8);
        }
        else {
          (iVar28._M_current)->z = local_f8.z;
          (iVar28._M_current)->x = local_f8.x;
          (iVar28._M_current)->y = local_f8.y;
          *(long *)(lVar17 + 0x48) = *(long *)(lVar17 + 0x48) + 0x18;
        }
        paVar31 = paVar31 + 1;
      } while (paVar31 != paVar24);
      plVar20 = plVar20 + 1;
      pPVar23 = local_d8;
      contours = local_d0;
    } while (plVar20 != local_c8);
  }
LAB_005b1737:
  current._M_current = local_70 + 1;
  if (current._M_current == pPVar23) {
    return local_120;
  }
  goto LAB_005b0ea1;
}

Assistant:

size_t CloseWindows(ContourVector& contours,
    const IfcMatrix4& minv,
    OpeningRefVector& contours_to_openings,
    TempMesh& curmesh)
{
    size_t closed = 0;
    // For all contour points, check if one of the assigned openings does
    // already have points assigned to it. In this case, assume this is
    // the other side of the wall and generate connections between
    // the two holes in order to close the window.

    // All this gets complicated by the fact that contours may pertain to
    // multiple openings(due to merging of adjacent or overlapping openings).
    // The code is based on the assumption that this happens symmetrically
    // on both sides of the wall. If it doesn't (which would be a bug anyway)
    // wrong geometry may be generated.
    for (ContourVector::iterator it = contours.begin(), end = contours.end(); it != end; ++it) {
        if ((*it).IsInvalid()) {
            continue;
        }
        OpeningRefs& refs = contours_to_openings[std::distance(contours.begin(), it)];

        bool has_other_side = false;
        for(const TempOpening* opening : refs) {
            if(!opening->wallPoints.empty()) {
                has_other_side = true;
                break;
            }
        }

        if (has_other_side) {

            ContourRefVector adjacent_contours;

            // prepare a skiplist for this contour. The skiplist is used to
            // eliminate unwanted contour lines for adjacent windows and
            // those bordering the outer frame.
            (*it).PrepareSkiplist();

            FindAdjacentContours(it, contours);
            FindBorderContours(it);

            // if the window is the result of a finite union or intersection of rectangles,
            // there shouldn't be any crossing or diagonal lines in it. Such lines would
            // be artifacts caused by numerical inaccuracies or other bugs in polyclipper
            // and our own code. Since rectangular openings are by far the most frequent
            // case, it is worth filtering for this corner case.
            if((*it).is_rectangular) {
                FindLikelyCrossingLines(it);
            }

            ai_assert((*it).skiplist.size() == (*it).contour.size());

            SkipList::const_iterator skipbegin = (*it).skiplist.begin();

            curmesh.mVerts.reserve(curmesh.mVerts.size() + (*it).contour.size() * 4);
            curmesh.mVertcnt.reserve(curmesh.mVertcnt.size() + (*it).contour.size());

			bool reverseCountourFaces = false;

            // compare base poly normal and contour normal to detect if we need to reverse the face winding
			if(curmesh.mVertcnt.size() > 0) {
				IfcVector3 basePolyNormal = TempMesh::ComputePolygonNormal(curmesh.mVerts.data(), curmesh.mVertcnt.front());
				
				std::vector<IfcVector3> worldSpaceContourVtx(it->contour.size());
				
				for(size_t a = 0; a < it->contour.size(); ++a)
					worldSpaceContourVtx[a] = minv * IfcVector3(it->contour[a].x, it->contour[a].y, 0.0);
				
				IfcVector3 contourNormal = TempMesh::ComputePolygonNormal(worldSpaceContourVtx.data(), worldSpaceContourVtx.size());
				
				reverseCountourFaces = (contourNormal * basePolyNormal) > 0.0;
			}

            // XXX this algorithm is really a bit inefficient - both in terms
            // of constant factor and of asymptotic runtime.
            std::vector<bool>::const_iterator skipit = skipbegin;

            IfcVector3 start0;
            IfcVector3 start1;

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();

            bool drop_this_edge = false;
            for (Contour::const_iterator cit = cbegin; cit != cend; ++cit, drop_this_edge = *skipit++) {
                const IfcVector2& proj_point = *cit;

                // Locate the closest opposite point. This should be a good heuristic to
                // connect only the points that are really intended to be connected.
                IfcFloat best = static_cast<IfcFloat>(1e10);
                IfcVector3 bestv;

                const IfcVector3 world_point = minv * IfcVector3(proj_point.x,proj_point.y,0.0f);

                for(const TempOpening* opening : refs) {
                    for(const IfcVector3& other : opening->wallPoints) {
                        const IfcFloat sqdist = (world_point - other).SquareLength();

                        if (sqdist < best) {
                            // avoid self-connections
                            if(sqdist < 1e-5) {
                                continue;
                            }

                            bestv = other;
                            best = sqdist;
                        }
                    }
                }

                if (drop_this_edge) {
                    curmesh.mVerts.pop_back();
                    curmesh.mVerts.pop_back();
                }
                else {
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? world_point : bestv);
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? bestv : world_point);

                    curmesh.mVertcnt.push_back(4);
                    ++closed;
                }

                if (cit == cbegin) {
                    start0 = world_point;
                    start1 = bestv;
                    continue;
                }

                curmesh.mVerts.push_back(reverseCountourFaces ? bestv : world_point);
                curmesh.mVerts.push_back(reverseCountourFaces ? world_point : bestv);

                if (cit == cend - 1) {
                    drop_this_edge = *skipit;

                    // Check if the final connection (last to first element) is itself
                    // a border edge that needs to be dropped.
                    if (drop_this_edge) {
                        --closed;
                        curmesh.mVertcnt.pop_back();
                        curmesh.mVerts.pop_back();
                        curmesh.mVerts.pop_back();
                    }
                    else {
                        curmesh.mVerts.push_back(reverseCountourFaces ? start0 : start1);
                        curmesh.mVerts.push_back(reverseCountourFaces ? start1 : start0);
                    }
                }
            }
        }
        else {

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();
            for(TempOpening* opening : refs) {
                ai_assert(opening->wallPoints.empty());
                opening->wallPoints.reserve(opening->wallPoints.capacity() + (*it).contour.size());
                for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {

                    const IfcVector2& proj_point = *cit;
                    opening->wallPoints.push_back(minv * IfcVector3(proj_point.x,proj_point.y,0.0f));
                }
            }
        }
    }
    return closed;
}